

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall line_hash_8::test_method(line_hash_8 *this)

{
  shared_count *this_00;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char *local_b8;
  const_string local_b0;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  undefined1 **local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  undefined4 **local_68;
  assertion_result local_60;
  undefined1 *local_48;
  undefined4 *local_40;
  undefined4 local_38;
  undefined1 local_31;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3f;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_48 = &local_31;
  local_31 = 0;
  local_40 = &local_38;
  local_38 = 0;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_98 = 0;
  local_78 = 0;
  local_88 = &local_48;
  local_a0 = &PTR__lazy_ostream_001b7cf8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_40;
  local_80 = &PTR__lazy_ostream_001b7b38;
  local_70 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_d0,&local_b0,0x3f,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint8_t >( 0 )",&local_a0,"0",&local_80);
  this_00 = &local_60.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x40;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_31 = 0x12;
  local_38 = 0x12;
  local_98 = 0;
  local_78 = 0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = &local_31;
  local_a0 = &PTR__lazy_ostream_001b7cf8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_48;
  local_40 = &local_38;
  local_80 = &PTR__lazy_ostream_001b7b38;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_d0,&local_b0,0x40,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint8_t >( 0x12 )",&local_a0,"0x12",&local_80);
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_60.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_60.m_message.px = (element_type *)0x0;
  local_60.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  local_b0.m_end = "";
  local_48 = &local_31;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7cf8;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_48;
  local_40 = &local_38;
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_001b7b38;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = &local_40;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x41;
  local_31 = 0x14;
  local_38 = 0x14;
  boost::test_tools::tt_detail::report_assertion
            (&local_60,&local_d0,&local_b0,0x41,CHECK,CHECK_EQUAL,2,
             "ah::line_hash< std::uint8_t >( 0x12345678 )",&local_a0,
             "( 0x78 + 0x56 + 0x34 + 0x12 ) & 0xff",&local_80);
  boost::detail::shared_count::~shared_count(&local_60.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( line_hash_8 )
{
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0 ), 0 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0x12 ), 0x12 );
    BOOST_CHECK_EQUAL( ah::line_hash< std::uint8_t >( 0x12345678 ), ( 0x78 + 0x56 + 0x34 + 0x12 ) & 0xff );
}